

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Rct.cpp
# Opt level: O1

bool Rct::readFile(Path *path,String *data,mode_t *perm)

{
  bool bVar1;
  Type TVar2;
  FILE *__stream;
  
  TVar2 = Path::type(path);
  if ((TVar2 == File) &&
     (__stream = fopen((path->super_String).mString._M_dataplus._M_p,"r"), __stream != (FILE *)0x0))
  {
    bVar1 = readFile((FILE *)__stream,data,perm);
    fclose(__stream);
    return bVar1;
  }
  return false;
}

Assistant:

bool readFile(const Path& path, String& data, mode_t *perm)
{
    if (!path.isFile())
        return false;
    FILE *f = fopen(path.nullTerminated(), "r");
    if (!f)
        return false;
    const bool ret = readFile(f, data, perm);
    fclose(f);
    return ret;
}